

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeFrom
          (MessageGenerator *this,Printer *printer)

{
  Formatter *this_00;
  pointer ppFVar1;
  FieldDescriptor *pFVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined1 auVar5 [8];
  bool bVar6;
  int iVar7;
  int iVar8;
  uint32 n;
  uint uVar9;
  LogMessage *pLVar10;
  FieldGenerator *pFVar11;
  FieldDescriptor *pFVar12;
  char *pcVar13;
  bool bVar14;
  string *from;
  long lVar15;
  int cached_has_word_index_00;
  int extraout_EDX;
  int extraout_EDX_00;
  vector<int,_std::allocator<int>_> *has_bit_indices;
  AlphaNum *a;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  AlphaNum *a_00;
  pointer ppFVar16;
  anon_unknown_0 *this_01;
  Descriptor *descriptor;
  Printer *in_R8;
  ulong uVar17;
  undefined8 *puVar18;
  bool bVar19;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Db;
  Hex HVar22;
  Hex HVar23;
  undefined1 local_1d8 [8];
  ColdChunkSkipper cold_skipper;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  Iterator __end4;
  Iterator __end3;
  AlphaNum local_128;
  undefined1 local_f0 [8];
  Iterator __begin4;
  undefined1 auStack_d8 [8];
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  undefined1 local_b0 [8];
  string chunk_mask_str;
  Formatter format;
  int local_34 [2];
  int cached_has_word_index;
  
  chunk_mask_str.field_2._8_8_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&format,&(this->variables_)._M_t);
  Formatter::operator()<>
            ((Formatter *)((long)&chunk_mask_str.field_2 + 8),
             "void $classname$::MergeFrom(const $classname$& from) {\n// @@protoc_insertion_point(class_specific_merge_from_start:$full_name$)\n  $DCHK$_NE(&from, this);\n"
            );
  google::protobuf::io::Printer::Indent();
  descriptor = this->descriptor_;
  if (0 < *(int *)(descriptor + 0x7c)) {
    Formatter::operator()<>
              ((Formatter *)((long)&chunk_mask_str.field_2 + 8),
               "_extensions_.MergeFrom(from._extensions_);\n");
    descriptor = this->descriptor_;
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars;
  vars._M_t._M_impl._0_4_ = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&this->options_;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  SetUnknkownFieldsVariable
            (descriptor,(Options *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&cold_skipper.limit_chunk_);
  Formatter::AddMap((Formatter *)((long)&chunk_mask_str.field_2 + 8),
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&cold_skipper.limit_chunk_);
  Formatter::operator()<>
            ((Formatter *)((long)&chunk_mask_str.field_2 + 8),
             "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_metadata_);\n$uint32$ cached_has_bits = 0;\n(void) cached_has_bits;\n\n"
            );
  uVar20 = 0;
  uVar21 = 0;
  chunks.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_d8 = (undefined1  [8])0x0;
  chunks.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ppFVar1 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar16 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppFVar16 != ppFVar1;
      ppFVar16 = ppFVar16 + 1) {
    pFVar2 = *ppFVar16;
    local_1d8 = (undefined1  [8])pFVar2;
    if (auStack_d8 ==
        (undefined1  [8])
        chunks.
        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
LAB_002091a9:
      std::
      vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ::emplace_back<>((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        *)auStack_d8);
    }
    else {
      iVar7 = HasByteIndex(this,chunks.
                                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1]);
      iVar8 = HasByteIndex(this,pFVar2);
      if (iVar7 != iVar8) goto LAB_002091a9;
    }
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back(chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + -1,(value_type *)local_1d8);
    uVar20 = extraout_XMM0_Da;
    uVar21 = extraout_XMM0_Db;
  }
  __begin4.descriptor = (OneofDescriptor *)&this->has_bit_indices_;
  anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
            ((ColdChunkSkipper *)local_1d8,
             (Options *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              *)auStack_d8,(vector<int,_std::allocator<int>_> *)__begin4.descriptor,
             (double)CONCAT44(uVar21,uVar20));
  local_34[0] = -1;
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&this->field_generators_;
  uVar17 = 0;
  do {
    auVar5 = auStack_d8;
    if ((ulong)(((long)chunks.
                       super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_d8) / 0x18) <=
        uVar17) {
      chunk_mask_str._M_dataplus._M_p = (pointer)this->descriptor_;
      local_b0._0_4_ = 0;
      __end4.descriptor._0_4_ =
           *(undefined4 *)((Descriptor *)chunk_mask_str._M_dataplus._M_p + 0x70);
      this_00 = (Formatter *)(&chunk_mask_str.field_2._M_allocated_capacity + 1);
      while (bVar19 = operator!=((Iterator *)local_b0,(Iterator *)&__end4.descriptor), bVar19) {
        lVar15 = (long)(int)local_b0._0_4_;
        lVar4 = *(long *)(chunk_mask_str._M_dataplus._M_p + 0x30);
        Formatter::operator()
                  (this_00,"switch (from.$1$_case()) {\n",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar4 + lVar15 * 0x30));
        google::protobuf::io::Printer::Indent();
        puVar18 = (undefined8 *)(lVar4 + lVar15 * 0x30);
        local_f0._0_4_ = 0;
        vars._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = *(undefined4 *)(puVar18 + 3);
        __end4._0_8_ = puVar18;
        __begin4._0_8_ = puVar18;
        while (bVar19 = operator!=((Iterator *)local_f0,
                                   (Iterator *)
                                   &vars._M_t._M_impl.super__Rb_tree_header._M_node_count), bVar19)
        {
          pFVar2 = *(FieldDescriptor **)
                    (*(long *)(__begin4._0_8_ + 0x20) + (long)(int)local_f0._0_4_ * 8);
          UnderscoresToCamelCase((string *)&local_128,*(string **)pFVar2,true);
          Formatter::operator()
                    (this_00,"case k$1$: {\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128
                    );
          std::__cxx11::string::~string((string *)&local_128);
          google::protobuf::io::Printer::Indent();
          pFVar11 = FieldGeneratorMap::get
                              ((FieldGeneratorMap *)
                               format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,pFVar2)
          ;
          (*pFVar11->_vptr_FieldGenerator[0xc])(pFVar11,printer);
          Formatter::operator()<>(this_00,"break;\n");
          google::protobuf::io::Printer::Outdent();
          Formatter::operator()<>(this_00,"}\n");
          local_f0._0_4_ = local_f0._0_4_ + 1;
        }
        ToUpper((string *)&local_128,(string *)*puVar18);
        Formatter::operator()
                  (this_00,"case $1$_NOT_SET: {\n  break;\n}\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        google::protobuf::io::Printer::Outdent();
        Formatter::operator()<>(this_00,"}\n");
        local_b0._0_4_ = local_b0._0_4_ + 1;
      }
      if (this->num_weak_fields_ != 0) {
        Formatter::operator()<>
                  ((Formatter *)((long)&chunk_mask_str.field_2 + 8),
                   "_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
      }
      google::protobuf::io::Printer::Outdent();
      Formatter::operator()<>((Formatter *)((long)&chunk_mask_str.field_2 + 8),"}\n");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&cold_skipper.cold_threshold_);
      std::
      vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ::~vector((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 *)auStack_d8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&cold_skipper.limit_chunk_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&format);
      return;
    }
    ppFVar16 = (((pointer)((long)auStack_d8 + uVar17 * 0x18))->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    from = (string *)
           ((long)(((pointer)((long)auStack_d8 + uVar17 * 0x18))->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar16);
    if (from < (string *)0x9) {
      bVar19 = false;
    }
    else {
      iVar7 = HasByteIndex(this,*ppFVar16);
      bVar19 = iVar7 != -1;
    }
    std::__cxx11::string::string((string *)&local_128,"from.",(allocator *)local_b0);
    anon_unknown_0::ColdChunkSkipper::OnStartChunk
              ((ColdChunkSkipper *)local_1d8,(int)printer,cached_has_word_index_00,from,in_R8);
    this_01 = (anon_unknown_0 *)((long)auVar5 + uVar17 * 0x18);
    std::__cxx11::string::~string((string *)&local_128);
    if (bVar19) {
      n = anon_unknown_0::GenChunkMask
                    (this_01,(vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              *)__begin4.descriptor,has_bit_indices);
      HVar22.value = (ulong)n;
      HVar22._8_8_ = 8;
      google::protobuf::strings::AlphaNum::AlphaNum(&local_128,HVar22);
      StrCat_abi_cxx11_((string *)local_b0,(protobuf *)&local_128,a);
      uVar9 = anon_unknown_0::popcnt(n);
      if ((int)uVar9 < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)&local_128,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xca1);
        pLVar10 = (LogMessage *)
                  google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)&local_128,"CHECK failed: (2) <= (popcnt(chunk_mask)): ")
        ;
        google::protobuf::internal::LogFinisher::operator=
                  ((LogFinisher *)&__end4.descriptor,pLVar10);
LAB_0020934f:
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)&local_128);
      }
      else if (8 < uVar9) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)&local_128,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xca2);
        pLVar10 = (LogMessage *)
                  google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)&local_128,"CHECK failed: (8) >= (popcnt(chunk_mask)): ")
        ;
        google::protobuf::internal::LogFinisher::operator=
                  ((LogFinisher *)&__end4.descriptor,pLVar10);
        goto LAB_0020934f;
      }
      iVar7 = local_34[0];
      iVar8 = HasWordIndex(this,(FieldDescriptor *)**(undefined8 **)this_01);
      if (iVar7 != iVar8) {
        local_34[0] = HasWordIndex(this,(FieldDescriptor *)**(undefined8 **)this_01);
        Formatter::operator()
                  ((Formatter *)((long)&chunk_mask_str.field_2 + 8),
                   "cached_has_bits = from._has_bits_[$1$];\n",local_34);
      }
      Formatter::operator()
                ((Formatter *)((long)&chunk_mask_str.field_2 + 8),
                 "if (cached_has_bits & 0x$1$u) {\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
      google::protobuf::io::Printer::Indent();
      std::__cxx11::string::~string((string *)local_b0);
    }
    puVar3 = *(undefined8 **)(this_01 + 8);
    bVar14 = false;
    for (puVar18 = *(undefined8 **)this_01; puVar18 != puVar3; puVar18 = puVar18 + 1) {
      pFVar2 = (FieldDescriptor *)*puVar18;
      pFVar11 = FieldGeneratorMap::get
                          ((FieldGeneratorMap *)
                           format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,pFVar2);
      if (*(int *)(pFVar2 + 0x3c) == 1) {
        bVar6 = HasHasbit(pFVar2);
        if (bVar6) goto LAB_00209434;
        std::__cxx11::string::string((string *)&local_128,"from.",(allocator *)local_b0);
        bVar6 = anon_unknown_0::EmitFieldNonDefaultCondition(printer,(string *)&local_128,pFVar2);
        std::__cxx11::string::~string((string *)&local_128);
        (*pFVar11->_vptr_FieldGenerator[0xc])(pFVar11,printer);
        if (bVar6) {
          google::protobuf::io::Printer::Outdent();
          Formatter::operator()<>((Formatter *)((long)&chunk_mask_str.field_2 + 8),"}\n");
        }
      }
      else if (*(int *)(pFVar2 + 0x3c) == 3) {
        (*pFVar11->_vptr_FieldGenerator[0xc])(pFVar11,printer);
      }
      else {
LAB_00209434:
        iVar7 = local_34[0];
        if ((*(char *)(*(long *)(pFVar2 + 0x78) + 0x4f) == '\0') &&
           (pFVar12 = pFVar2, iVar8 = HasWordIndex(this,pFVar2), iVar7 == iVar8)) {
          bVar6 = HasHasbit(pFVar2);
          iVar7 = extraout_EDX;
          if (!bVar6) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)&local_128,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xcca);
            pFVar12 = (FieldDescriptor *)
                      google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)&local_128,"CHECK failed: HasHasbit(field): ");
            google::protobuf::internal::LogFinisher::operator=
                      ((LogFinisher *)local_b0,(LogMessage *)pFVar12);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)&local_128);
            iVar7 = extraout_EDX_00;
          }
          pcVar13 = FieldDescriptor::index(pFVar2,(char *)pFVar12,iVar7);
          HVar23.value = 1L << (*(byte *)(*(long *)__begin4.descriptor + (long)(int)pcVar13 * 4) &
                               0x1f);
          HVar23._8_8_ = 8;
          google::protobuf::strings::AlphaNum::AlphaNum(&local_128,HVar23);
          StrCat_abi_cxx11_((string *)local_b0,(protobuf *)&local_128,a_00);
          Formatter::operator()
                    ((Formatter *)((long)&chunk_mask_str.field_2 + 8),
                     "if (cached_has_bits & 0x$1$u) {\n",(string *)local_b0);
          google::protobuf::io::Printer::Indent();
          if ((bVar19) && (bVar6 = anon_unknown_0::IsPOD(pFVar2), bVar6)) {
            bVar14 = true;
            (*pFVar11->_vptr_FieldGenerator[0xd])(pFVar11,printer);
          }
          else {
            (*pFVar11->_vptr_FieldGenerator[0xc])(pFVar11,printer);
          }
          google::protobuf::io::Printer::Outdent();
          Formatter::operator()<>((Formatter *)((long)&chunk_mask_str.field_2 + 8),"}\n");
          std::__cxx11::string::~string((string *)local_b0);
        }
        else {
          bVar6 = HasHasbit(pFVar2);
          pFVar12 = extraout_RDX;
          if (!bVar6) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)&local_128,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xcc2);
            pLVar10 = (LogMessage *)
                      google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)&local_128,"CHECK failed: HasHasbit(field): ");
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_b0,pLVar10);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)&local_128);
            pFVar12 = extraout_RDX_00;
          }
          FieldName_abi_cxx11_((string *)&local_128,(cpp *)pFVar2,pFVar12);
          Formatter::operator()
                    ((Formatter *)((long)&chunk_mask_str.field_2 + 8),
                     "if (from._internal_has_$1$()) {\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128
                    );
          std::__cxx11::string::~string((string *)&local_128);
          google::protobuf::io::Printer::Indent();
          (*pFVar11->_vptr_FieldGenerator[0xc])(pFVar11,printer);
          google::protobuf::io::Printer::Outdent();
          Formatter::operator()<>((Formatter *)((long)&chunk_mask_str.field_2 + 8),"}\n");
        }
      }
    }
    if (bVar19) {
      if (bVar14) {
        if (local_34[0] < 0) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)&local_128,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xce2);
          pLVar10 = (LogMessage *)
                    google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)&local_128,
                               "CHECK failed: (0) <= (cached_has_word_index): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_b0,pLVar10);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)&local_128);
        }
        Formatter::operator()
                  ((Formatter *)((long)&chunk_mask_str.field_2 + 8),
                   "_has_bits_[$1$] |= cached_has_bits;\n",local_34);
      }
      google::protobuf::io::Printer::Outdent();
      Formatter::operator()<>((Formatter *)((long)&chunk_mask_str.field_2 + 8),"}\n");
    }
    bVar19 = anon_unknown_0::ColdChunkSkipper::OnEndChunk
                       ((ColdChunkSkipper *)local_1d8,(int)uVar17,printer);
    if (bVar19) {
      local_34[0] = -1;
    }
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void MessageGenerator::GenerateClassSpecificMergeFrom(io::Printer* printer) {
  // Generate the class-specific MergeFrom, which avoids the GOOGLE_CHECK and cast.
  Formatter format(printer, variables_);
  format(
      "void $classname$::MergeFrom(const $classname$& from) {\n"
      "// @@protoc_insertion_point(class_specific_merge_from_start:"
      "$full_name$)\n"
      "  $DCHK$_NE(&from, this);\n");
  format.Indent();

  if (descriptor_->extension_range_count() > 0) {
    format("_extensions_.MergeFrom(from._extensions_);\n");
  }
  std::map<std::string, std::string> vars;
  SetUnknkownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);
  format(
      "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_"
      "metadata_);\n"
      "$uint32$ cached_has_bits = 0;\n"
      "(void) cached_has_bits;\n\n");

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return HasByteIndex(a) == HasByteIndex(b);
      });

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);

  // cached_has_word_index maintains that:
  //   cached_has_bits = from._has_bits_[cached_has_word_index]
  // for cached_has_word_index >= 0
  int cached_has_word_index = -1;

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    const std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    bool have_outer_if =
        chunk.size() > 1 && HasByteIndex(chunk.front()) != kNoHasbit;
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "from.",
                              printer);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32 chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = from._has_bits_[$1$];\n",
               cached_has_word_index);
      }

      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    // Go back and emit merging code for each of the fields we processed.
    bool deferred_has_bit_changes = false;
    for (const auto field : chunk) {
      const FieldGenerator& generator = field_generators_.get(field);

      if (field->is_repeated()) {
        generator.GenerateMergingCode(printer);
      } else if (field->is_optional() && !HasHasbit(field)) {
        // Merge semantics without true field presence: primitive fields are
        // merged only if non-zero (numeric) or non-empty (string).
        bool have_enclosing_if =
            EmitFieldNonDefaultCondition(printer, "from.", field);
        generator.GenerateMergingCode(printer);
        if (have_enclosing_if) {
          format.Outdent();
          format("}\n");
        }
      } else if (field->options().weak() ||
                 cached_has_word_index != HasWordIndex(field)) {
        // Check hasbit, not using cached bits.
        GOOGLE_CHECK(HasHasbit(field));
        format("if (from._internal_has_$1$()) {\n", FieldName(field));
        format.Indent();
        generator.GenerateMergingCode(printer);
        format.Outdent();
        format("}\n");
      } else {
        // Check hasbit, using cached bits.
        GOOGLE_CHECK(HasHasbit(field));
        int has_bit_index = has_bit_indices_[field->index()];
        const std::string mask = StrCat(
            strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
        format("if (cached_has_bits & 0x$1$u) {\n", mask);
        format.Indent();

        if (have_outer_if && IsPOD(field)) {
          // Defer hasbit modification until the end of chunk.
          // This can reduce the number of loads/stores by up to 7 per 8 fields.
          deferred_has_bit_changes = true;
          generator.GenerateCopyConstructorCode(printer);
        } else {
          generator.GenerateMergingCode(printer);
        }

        format.Outdent();
        format("}\n");
      }
    }

    if (have_outer_if) {
      if (deferred_has_bit_changes) {
        // Flush the has bits for the primitives we deferred.
        GOOGLE_CHECK_LE(0, cached_has_word_index);
        format("_has_bits_[$1$] |= cached_has_bits;\n", cached_has_word_index);
      }

      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Merge oneof fields. Oneof field requires oneof case check.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("switch (from.$1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (IsFieldUsed(field, options_)) {
        field_generators_.get(field).GenerateMergingCode(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }
  if (num_weak_fields_) {
    format("_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
  }

  format.Outdent();
  format("}\n");
}